

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

char * mpack_expect_ext_alloc(mpack_reader_t *reader,int8_t *type,size_t maxsize,size_t *size)

{
  char *pcVar1;
  size_t count;
  mpack_tag_t mVar2;
  
  *size = 0;
  mVar2 = mpack_read_tag(reader);
  if (mVar2.type == mpack_type_ext) {
    *type = mVar2.v._0_1_;
  }
  count = mVar2.v.u >> 0x20;
  if (maxsize < count) {
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_type;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_type);
      }
    }
    count = 0;
  }
  pcVar1 = mpack_read_bytes_alloc_impl(reader,count,false);
  if (pcVar1 != (char *)0x0) {
    *size = count;
  }
  return pcVar1;
}

Assistant:

char* mpack_expect_ext_alloc(mpack_reader_t* reader, int8_t* type, size_t maxsize, size_t* size) {
    mpack_assert(size != NULL, "size cannot be NULL");
    *size = 0;

    if (maxsize > UINT32_MAX)
        maxsize = UINT32_MAX;

    size_t length = mpack_expect_ext_max(reader, type, (uint32_t)maxsize);
    char* data = mpack_read_bytes_alloc(reader, length);
    mpack_done_ext(reader);

    if (data)
        *size = length;
    return data;
}